

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O2

LispPTR rplaca(LispPTR x,LispPTR y)

{
  uint LAddr;
  DLword *pDVar1;
  LispPTR LVar2;
  LispPTR ptr;
  LispPTR *pLVar3;
  
  if ((*(ushort *)((ulong)(x >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
    pLVar3 = NativeAligned4FromLAddr(x);
    pDVar1 = MDStypetbl;
    LVar2 = car(x);
    if ((-1 < *(short *)((ulong)(pDVar1 + (LVar2 >> 9)) ^ 2)) && (*GcDisabled_word != 0x4c)) {
      LVar2 = *Reclaim_cnt_word;
      ptr = car(x);
      if (LVar2 == 0) {
        rec_htfind(ptr,1);
      }
      else {
        htfind(ptr,1);
      }
    }
    if ((-1 < *(short *)((ulong)(y >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      if (*Reclaim_cnt_word == 0) {
        rec_htfind(y,0);
      }
      else {
        htfind(y,0);
      }
    }
    LAddr = *pLVar3;
    if (LAddr < 0x10000000) {
      pLVar3 = NativeAligned4FromLAddr(LAddr);
      *pLVar3 = *pLVar3 & 0xf0000000 | y & 0xfffffff;
    }
    else {
      *pLVar3 = LAddr & 0xf0000000 | y & 0xfffffff;
    }
  }
  else if (x == 0) {
    x = 0;
    if (y != 0) {
      error("Attempt to RPLACA NIL");
    }
  }
  else {
    error("ARG not List");
    x = 0;
  }
  return x;
}

Assistant:

LispPTR rplaca(LispPTR x, LispPTR y)
{
  ConsCell *x_68k;
  ConsCell *temp;

#ifdef TRACE2
  printf("TRACE: rplaca()\n");
#endif

  if (Listp(x) == NIL) { /* arg isn't a CONS cell, might be NIL */
    if (x == NIL_PTR) {
      if (y != NIL_PTR)
        error("Attempt to RPLACA NIL");
      else
        return (NIL_PTR);
    } else
      error("ARG not List");
      return (NIL_PTR); /* NOT REACHED */
  }

  else {
    x_68k = (ConsCell *)NativeAligned4FromLAddr(x);

    GCLOOKUP(car(x), DELREF); /* set up reference count */
    GCLOOKUP(y, ADDREF);

    if (x_68k->cdr_code == CDR_INDIRECT) {
      temp = (ConsCell *)NativeAligned4FromLAddr((LispPTR)x_68k->car_field);
      temp->car_field = y;
    } else
      x_68k->car_field = y;

    return (x);
  }
}